

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_26::RustCodeGenerator::GenerateCode
          (RustCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  RustGenerator generator;
  RustGenerator RStack_3f8;
  
  rust::RustGenerator::RustGenerator(&RStack_3f8,parser,path,filename);
  bVar1 = rust::RustGenerator::generate(&RStack_3f8);
  rust::RustGenerator::~RustGenerator(&RStack_3f8);
  return (Status)!bVar1;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateRust(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }